

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O1

StructType * LLVMBC::StructType::get(LLVMContext *context,Vector<Type_*> *member_types)

{
  pointer *pppTVar1;
  StructType *pSVar2;
  pointer ppTVar3;
  pointer ppTVar4;
  iterator __position;
  bool bVar5;
  StructType *pSVar6;
  pointer ppTVar7;
  ulong uVar8;
  StructType *unaff_R14;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  StructType *local_30;
  
  for (ppTVar7 = (context->type_cache).
                 super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar5 = ppTVar7 ==
              (context->type_cache).
              super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
              _M_impl.super__Vector_impl_data._M_finish, pSVar6 = unaff_R14, !bVar5;
      ppTVar7 = ppTVar7 + 1) {
    pSVar2 = (StructType *)*ppTVar7;
    bVar11 = true;
    if ((pSVar2->super_Type).type_id == StructTyID) {
      ppTVar3 = (pSVar2->member_types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(pSVar2->member_types).
                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar3;
      ppTVar4 = (member_types->
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>)
                ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(member_types->
                     super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4 >> 3;
      if (uVar10 == (uVar8 >> 3 & 0xffffffff)) {
        uVar9 = (uint)uVar10;
        bVar11 = uVar9 != 0;
        pSVar6 = pSVar2;
        if (bVar11) {
          uVar10 = 0;
          do {
            if ((ulong)((long)uVar8 >> 3) <= uVar10) {
              __assert_fail("N < member_types.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/bc/type.cpp"
                            ,0xbf,"Type *LLVMBC::StructType::getElementType(unsigned int) const");
            }
            pSVar6 = unaff_R14;
            if (ppTVar4[uVar10] != ppTVar3[uVar10]) break;
            uVar10 = uVar10 + 1;
            bVar11 = (uint)uVar10 < uVar9;
            pSVar6 = pSVar2;
          } while (uVar9 != (uint)uVar10);
        }
      }
    }
    if (!bVar11) break;
    unaff_R14 = pSVar6;
  }
  if (bVar5) {
    pSVar6 = LLVMContext::
             construct<LLVMBC::StructType,LLVMBC::LLVMContext&,std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>>
                       (context,context,member_types);
    __position._M_current =
         (context->type_cache).
         super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (context->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_30 = pSVar6;
      std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
      _M_realloc_insert<LLVMBC::Type*>
                ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                 &context->type_cache,__position,(Type **)&local_30);
    }
    else {
      *__position._M_current = &pSVar6->super_Type;
      pppTVar1 = &(context->type_cache).
                  super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return pSVar6;
}

Assistant:

StructType *StructType::get(LLVMContext &context, Vector<Type *> member_types)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::StructTyID)
		{
			auto *struct_type = cast<StructType>(type);
			if (struct_type->getNumElements() == member_types.size())
			{
				bool equal = true;
				unsigned count = member_types.size();
				for (unsigned i = 0; i < count; i++)
				{
					if (member_types[i] != struct_type->getElementType(i))
					{
						equal = false;
						break;
					}
				}

				if (equal)
					return struct_type;
			}
		}
	}

	auto *type = context.construct<StructType>(context, std::move(member_types));
	cache.push_back(type);
	return type;
}